

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

SharedCameraModel __thiscall ary::CameraUser::getCameraModel(CameraUser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  SharedCameraModel SVar1;
  
  std::__shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  SVar1.super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedCameraModel)
         SVar1.super_shared_ptr<ary::CameraModel>.
         super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedCameraModel CameraUser::getCameraModel() {
	return camera;
}